

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

QCborValue * __thiscall
StashedContainer::intoValue
          (QCborValue *__return_storage_ptr__,StashedContainer *this,
          QExplicitlySharedDataPointer<QCborContainerPrivate> *parent)

{
  Type TVar1;
  QCborContainerPrivate *pQVar2;
  QExplicitlySharedDataPointer<QCborContainerPrivate> QVar3;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QCborContainerPrivate> __tmp;
  QExplicitlySharedDataPointer<QCborContainerPrivate> moved;
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_48;
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(this->stashed).d.ptr;
  (this->stashed).d.ptr = (QCborContainerPrivate *)0x0;
  pQVar2 = (parent->d).ptr;
  (parent->d).ptr = (QCborContainerPrivate *)0x0;
  local_40.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(this->stashed).d.ptr;
  (this->stashed).d.ptr = pQVar2;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_40);
  QVar3.d.ptr = local_48.d.ptr;
  local_48.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(QCborContainerPrivate *)0x0;
  local_40 = (QExplicitlySharedDataPointer<QCborContainerPrivate>)(parent->d).ptr;
  (parent->d).ptr = (QCborContainerPrivate *)QVar3;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_40);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_48);
  TVar1 = this->type;
  pQVar2 = (this->stashed).d.ptr;
  (this->stashed).d.ptr = (QCborContainerPrivate *)0x0;
  *(undefined1 **)&__return_storage_ptr__->t = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->container = (QCborContainerPrivate *)0x0;
  __return_storage_ptr__->t = TVar1;
  __return_storage_ptr__->n = -1;
  __return_storage_ptr__->container = pQVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue intoValue(QExplicitlySharedDataPointer<QCborContainerPrivate> *parent)
    {
        std::swap(stashed, *parent);
        return QCborContainerPrivate::makeValue(type, -1, stashed.take(),
                                                QCborContainerPrivate::MoveContainer);
    }